

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O0

void Imath_3_2::transform<float,float>
               (Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m,
               Box<Imath_3_2::Vec3<float>_> *result)

{
  bool bVar1;
  float *pfVar2;
  Box<Imath_3_2::Vec3<float>_> *in_RDX;
  Matrix44<float> *in_RSI;
  Box<Imath_3_2::Vec3<float>_> *in_RDI;
  float fVar3;
  int i_1;
  Vec3<float> points [8];
  float b;
  float a;
  int j;
  int i;
  Vec3<float> *in_stack_ffffffffffffff08;
  Box<Imath_3_2::Vec3<float>_> *this;
  float fVar4;
  undefined4 in_stack_ffffffffffffff28;
  float fVar5;
  undefined4 in_stack_ffffffffffffff2c;
  float fVar6;
  Vec3<float> *local_c0;
  int local_8c;
  Vec3<float> local_88;
  Vec3<float> VStack_7c;
  Vec3<float> VStack_70;
  Vec3<float> VStack_64;
  Vec3<float> VStack_58;
  Vec3<float> VStack_4c;
  Vec3<float> VStack_40;
  Vec3<float> VStack_34;
  Vec3<float> local_28;
  int local_1c;
  Box<Imath_3_2::Vec3<float>_> *local_18;
  Matrix44<float> *local_10;
  Box<Imath_3_2::Vec3<float>_> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = Box<Imath_3_2::Vec3<float>_>::isEmpty(in_RDI);
  if ((!bVar1) &&
     (bVar1 = Box<Imath_3_2::Vec3<float>_>::isInfinite
                        ((Box<Imath_3_2::Vec3<float>_> *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)), !bVar1)) {
    pfVar2 = Matrix44<float>::operator[](local_10,0);
    if ((pfVar2[3] == 0.0) && (!NAN(pfVar2[3]))) {
      pfVar2 = Matrix44<float>::operator[](local_10,1);
      if ((pfVar2[3] == 0.0) && (!NAN(pfVar2[3]))) {
        pfVar2 = Matrix44<float>::operator[](local_10,2);
        if ((pfVar2[3] == 0.0) && (!NAN(pfVar2[3]))) {
          pfVar2 = Matrix44<float>::operator[](local_10,3);
          if ((pfVar2[3] == 1.0) && (!NAN(pfVar2[3]))) {
            for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
              pfVar2 = Matrix44<float>::operator[](local_10,3);
              fVar3 = pfVar2[local_1c];
              pfVar2 = Vec3<float>::operator[](&local_18->max,local_1c);
              *pfVar2 = fVar3;
              pfVar2 = Vec3<float>::operator[](&local_18->min,local_1c);
              *pfVar2 = fVar3;
              for (local_28.z = 0.0; (int)local_28.z < 3; local_28.z = (float)((int)local_28.z + 1))
              {
                pfVar2 = Matrix44<float>::operator[](local_10,(int)local_28.z);
                fVar3 = pfVar2[local_1c];
                pfVar2 = Vec3<float>::operator[](&local_8->min,(int)local_28.z);
                local_28.y = fVar3 * *pfVar2;
                pfVar2 = Matrix44<float>::operator[](local_10,(int)local_28.z);
                fVar3 = pfVar2[local_1c];
                pfVar2 = Vec3<float>::operator[](&local_8->max,(int)local_28.z);
                fVar4 = local_28.y;
                fVar3 = fVar3 * *pfVar2;
                local_28.x = fVar3;
                if (fVar3 <= local_28.y) {
                  pfVar2 = Vec3<float>::operator[](&local_18->min,local_1c);
                  fVar4 = local_28.y;
                  *pfVar2 = fVar3 + *pfVar2;
                  pfVar2 = Vec3<float>::operator[](&local_18->max,local_1c);
                  *pfVar2 = fVar4 + *pfVar2;
                }
                else {
                  pfVar2 = Vec3<float>::operator[](&local_18->min,local_1c);
                  fVar3 = local_28.x;
                  *pfVar2 = fVar4 + *pfVar2;
                  pfVar2 = Vec3<float>::operator[](&local_18->max,local_1c);
                  *pfVar2 = fVar3 + *pfVar2;
                }
              }
            }
            return;
          }
        }
      }
    }
    local_c0 = &local_88;
    do {
      Vec3<float>::Vec3(local_c0);
      local_c0 = local_c0 + 1;
    } while (local_c0 != &local_28);
    pfVar2 = Vec3<float>::operator[](&local_8->min,0);
    fVar3 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_64,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_70,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_7c,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&local_88,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&local_8->max,0);
    fVar3 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_34,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_40,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_4c,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_58,0);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&local_8->min,1);
    fVar3 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_4c,1);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_58,1);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&VStack_7c,1);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&local_88,1);
    *pfVar2 = fVar3;
    pfVar2 = Vec3<float>::operator[](&local_8->max,1);
    fVar4 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_34,1);
    *pfVar2 = fVar4;
    pfVar2 = Vec3<float>::operator[](&VStack_40,1);
    *pfVar2 = fVar4;
    pfVar2 = Vec3<float>::operator[](&VStack_64,1);
    *pfVar2 = fVar4;
    pfVar2 = Vec3<float>::operator[](&VStack_70,1);
    *pfVar2 = fVar4;
    pfVar2 = Vec3<float>::operator[](&local_8->min,2);
    fVar5 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_40,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](&VStack_58,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](&VStack_70,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](&local_88,2);
    *pfVar2 = fVar5;
    pfVar2 = Vec3<float>::operator[](&local_8->max,2);
    fVar6 = *pfVar2;
    pfVar2 = Vec3<float>::operator[](&VStack_34,2);
    *pfVar2 = fVar6;
    pfVar2 = Vec3<float>::operator[](&VStack_4c,2);
    *pfVar2 = fVar6;
    pfVar2 = Vec3<float>::operator[](&VStack_64,2);
    *pfVar2 = fVar6;
    pfVar2 = Vec3<float>::operator[](&VStack_7c,2);
    *pfVar2 = fVar6;
    for (local_8c = 0; local_8c < 8; local_8c = local_8c + 1) {
      this = local_18;
      operator*((Vec3<float> *)CONCAT44(fVar6,fVar5),(Matrix44<float> *)CONCAT44(fVar4,fVar3));
      Box<Imath_3_2::Vec3<float>_>::extendBy(this,in_stack_ffffffffffffff08);
    }
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
transform (const Box<Vec3<S>>& box, const Matrix44<T>& m, Box<Vec3<S>>& result)
    IMATH_NOEXCEPT
{
    if (box.isEmpty () || box.isInfinite ()) { return; }

    //
    // If the last column of m is (0 0 0 1) then m is an affine
    // transform, and we use the fast Graphics Gems trick.
    //

    if (m[0][3] == 0 && m[1][3] == 0 && m[2][3] == 0 && m[3][3] == 1)
    {
        for (int i = 0; i < 3; i++)
        {
            result.min[i] = result.max[i] = (S) m[3][i];

            for (int j = 0; j < 3; j++)
            {
                S a, b;

                a = (S) m[j][i] * box.min[j];
                b = (S) m[j][i] * box.max[j];

                if (a < b)
                {
                    result.min[i] += a;
                    result.max[i] += b;
                }
                else
                {
                    result.min[i] += b;
                    result.max[i] += a;
                }
            }
        }

        return;
    }

    //
    // M is a projection matrix.  Do things the naive way:
    // Transform the eight corners of the box, and find an
    // axis-parallel box that encloses the transformed corners.
    //

    Vec3<S> points[8];

    points[0][0] = points[1][0] = points[2][0] = points[3][0] = box.min[0];
    points[4][0] = points[5][0] = points[6][0] = points[7][0] = box.max[0];

    points[0][1] = points[1][1] = points[4][1] = points[5][1] = box.min[1];
    points[2][1] = points[3][1] = points[6][1] = points[7][1] = box.max[1];

    points[0][2] = points[2][2] = points[4][2] = points[6][2] = box.min[2];
    points[1][2] = points[3][2] = points[5][2] = points[7][2] = box.max[2];

    for (int i = 0; i < 8; i++)
        result.extendBy (points[i] * m);
}